

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

int uv_tty_get_winsize(uv_tty_t *tty,int *width,int *height)

{
  int iVar1;
  undefined8 in_RAX;
  int *piVar2;
  winsize ws;
  undefined8 local_28;
  
  local_28 = in_RAX;
  do {
    iVar1 = ioctl((tty->io_watcher).fd,0x5413,&local_28);
    if (iVar1 != -1) {
      *width = (uint)local_28._2_2_;
      *height = (uint)(ushort)local_28;
      return 0;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -*piVar2;
}

Assistant:

int uv_tty_get_winsize(uv_tty_t* tty, int* width, int* height) {
  struct winsize ws;
  int err;

  do
    err = ioctl(uv__stream_fd(tty), TIOCGWINSZ, &ws);
  while (err == -1 && errno == EINTR);

  if (err == -1)
    return -errno;

  *width = ws.ws_col;
  *height = ws.ws_row;

  return 0;
}